

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

_Bool MatrixCompare(Matrix *a,Matrix *b)

{
  int iVar1;
  _Bool _Var2;
  
  if ((a->rows == b->rows) && (a->columns == b->columns)) {
    iVar1 = bcmp(a->matrix,b->matrix,(ulong)a->rows * (ulong)a->columns * 0x10);
    _Var2 = iVar1 == 0;
  }
  else {
    _Var2 = false;
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixCompare");
  }
  return _Var2;
}

Assistant:

bool MatrixCompare(const Matrix *a, const Matrix *b) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return false;
  }
#endif
  return memcmp(a->matrix, b->matrix, sizeof(Real) * a->rows * a->columns) == 0 ? true : false;
}